

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(NearestNeighborsIndex *this)

{
  NearestNeighborsIndex *pNVar1;
  NearestNeighborsIndex *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NearestNeighborsIndex_0056b640;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::RepeatedPtrField
            (&this->floatsamples_);
  IndexTypeUnion::IndexTypeUnion((IndexTypeUnion *)&this->IndexType_);
  DistanceFunctionUnion::DistanceFunctionUnion((DistanceFunctionUnion *)&this->DistanceFunction_);
  pNVar1 = internal_default_instance();
  if (this != pNVar1) {
    protobuf_NearestNeighbors_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

NearestNeighborsIndex::NearestNeighborsIndex()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NearestNeighbors_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NearestNeighborsIndex)
}